

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

int read_features_string(vw *all,v_array<example_*> *examples)

{
  size_t sVar1;
  substring example;
  size_t num_chars;
  char *line;
  size_t local_28;
  char *local_20;
  
  sVar1 = read_features(all,&local_20,&local_28);
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    example.end = local_20 + local_28;
    example.begin = local_20;
    substring_to_example(all,*examples->_begin,example);
  }
  return (int)sVar1;
}

Assistant:

int read_features_string(vw* all, v_array<example*>& examples)
{
  char* line;
  size_t num_chars;
  size_t num_chars_initial = read_features(all, line, num_chars);
  if (num_chars_initial < 1)
    return (int)num_chars_initial;

  substring example = {line, line + num_chars};
  substring_to_example(all, examples[0], example);

  return (int)num_chars_initial;
}